

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall
spvtools::opt::CFG::ComputeStructuredOrder
          (CFG *this,Function *func,BasicBlock *root,BasicBlock *end,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  bool bVar1;
  FeatureManager *pFVar2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order_local;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  order_local = order;
  pFVar2 = IRContext::get_feature_mgr(this->module_->context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,CapabilityShader);
  if (bVar1) {
    ComputeStructuredSuccessors(this,func);
    local_60._8_8_ = 0;
    local_48 = std::
               _Function_handler<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:92:36)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:92:36)>
               ::_M_manager;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_90 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:89:23)>
               ::_M_invoke;
    local_80._8_8_ = 0;
    local_98 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:89:23)>
               ::_M_manager;
    local_80._M_unused._M_object = &order_local;
    local_68 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:98:21)>
               ::_M_invoke;
    local_70 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:98:21)>
               ::_M_manager;
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<bool_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:90:19)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:90:19)>
               ::_M_manager;
    local_60._M_unused._M_object = this;
    local_40._M_unused._M_object = end;
    CFA<spvtools::opt::BasicBlock>::DepthFirstTraversal
              (root,(get_blocks_func *)&local_60,
               (function<void_(const_spvtools::opt::BasicBlock_*)> *)&local_a8,
               (function<void_(const_spvtools::opt::BasicBlock_*)> *)&local_80,
               (function<bool_(const_spvtools::opt::BasicBlock_*)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    return;
  }
  __assert_fail("module_->context()->get_feature_mgr()->HasCapability( spv::Capability::Shader) && \"This only works on structured control flow\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                ,0x55,
                "void spvtools::opt::CFG::ComputeStructuredOrder(Function *, BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
               );
}

Assistant:

void CFG::ComputeStructuredOrder(Function* func, BasicBlock* root,
                                 BasicBlock* end,
                                 std::list<BasicBlock*>* order) {
  assert(module_->context()->get_feature_mgr()->HasCapability(
             spv::Capability::Shader) &&
         "This only works on structured control flow");

  // Compute structured successors and do DFS.
  ComputeStructuredSuccessors(func);
  auto ignore_block = [](cbb_ptr) {};
  auto terminal = [end](cbb_ptr bb) { return bb == end; };

  auto get_structured_successors = [this](const BasicBlock* b) {
    return &(block2structured_succs_[b]);
  };

  // TODO(greg-lunarg): Get rid of const_cast by making moving const
  // out of the cfa.h prototypes and into the invoking code.
  auto post_order = [&](cbb_ptr b) {
    order->push_front(const_cast<BasicBlock*>(b));
  };
  CFA<BasicBlock>::DepthFirstTraversal(root, get_structured_successors,
                                       ignore_block, post_order, terminal);
}